

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintSExpression::visitElementSegment(PrintSExpression *this,ElementSegment *curr)

{
  Expression *pEVar1;
  pointer ppEVar2;
  char *__s;
  char cVar3;
  Index IVar4;
  ostream *poVar5;
  size_t sVar6;
  pointer ppEVar7;
  long *local_58;
  long local_50;
  long local_48 [2];
  char local_31;
  
  local_31 = TableUtils::usesExpressions(curr,this->currModule);
  poVar5 = this->o;
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_58,local_50);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  local_58._0_1_ = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
  poVar5 = this->o;
  Colors::outputColorCode(poVar5,"\x1b[35m");
  Colors::outputColorCode(poVar5,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"elem ",5);
  Colors::outputColorCode(poVar5,"\x1b[0m");
  Name::print((Name *)curr,this->o);
  cVar3 = local_31;
  if ((curr->table).super_IString.str._M_str == (char *)0x0) {
    local_58._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
    if (cVar3 == '\0') {
LAB_00a2af84:
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"func",4);
      goto LAB_00a2af98;
    }
  }
  else {
    if ((local_31 != '\0') ||
       (8 < (ulong)((long)(this->currModule->tables).
                          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->currModule->tables).
                         super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start))) {
      std::__ostream_insert<char,std::char_traits<char>>(this->o," (table ",8);
      Name::print(&curr->table,this->o);
      std::__ostream_insert<char,std::char_traits<char>>(this->o,")",1);
    }
    local_58._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
    IVar4 = Measurer::measure(curr->offset);
    if (IVar4 < 2) {
      pEVar1 = curr->offset;
      printDebugLocation(this,pEVar1);
      Visitor<wasm::PrintSExpression,_void>::visit
                ((Visitor<wasm::PrintSExpression,_void> *)this,pEVar1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"(offset ",8);
      pEVar1 = curr->offset;
      printDebugLocation(this,pEVar1);
      Visitor<wasm::PrintSExpression,_void>::visit
                ((Visitor<wasm::PrintSExpression,_void> *)this,pEVar1);
      local_58._0_1_ = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
    }
    if (cVar3 == '\0') {
      if (8 < (ulong)((long)(this->currModule->tables).
                            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->currModule->tables).
                           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        local_58._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
        goto LAB_00a2af84;
      }
LAB_00a2af98:
      ppEVar7 = (curr->data).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppEVar2 = (curr->data).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppEVar7 != ppEVar2) {
        do {
          pEVar1 = *ppEVar7;
          if (pEVar1->_id != RefFuncId) {
            __assert_fail("int(_id) == int(T::SpecificId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                          ,0x31b,"T *wasm::Expression::cast() [T = wasm::RefFunc]");
          }
          local_58._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
          Name::print((Name *)(pEVar1 + 1),this->o);
          ppEVar7 = ppEVar7 + 1;
        } while (ppEVar7 != ppEVar2);
      }
      goto LAB_00a2afe3;
    }
    local_58._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
  }
  printType(this,(Type)(curr->type).id);
  ppEVar7 = (curr->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (curr->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar7 != ppEVar2) {
    do {
      pEVar1 = *ppEVar7;
      std::__ostream_insert<char,std::char_traits<char>>(this->o," (item ",7);
      printDebugLocation(this,pEVar1);
      Visitor<wasm::PrintSExpression,_void>::visit
                ((Visitor<wasm::PrintSExpression,_void> *)this,pEVar1);
      local_58._0_1_ = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
      ppEVar7 = ppEVar7 + 1;
    } while (ppEVar7 != ppEVar2);
  }
LAB_00a2afe3:
  local_58 = (long *)CONCAT71(local_58._1_7_,0x29);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
  __s = this->maybeNewLine;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar6);
  }
  return;
}

Assistant:

void PrintSExpression::visitElementSegment(ElementSegment* curr) {
  bool usesExpressions = TableUtils::usesExpressions(curr, currModule);
  auto printElemType = [&]() {
    if (!usesExpressions) {
      o << "func";
    } else {
      printType(curr->type);
    }
  };

  doIndent(o, indent);
  o << '(';
  printMedium(o, "elem ");
  curr->name.print(o);

  if (curr->table.is()) {
    if (usesExpressions || currModule->tables.size() > 1) {
      // tableuse
      o << " (table ";
      curr->table.print(o);
      o << ")";
    }

    o << ' ';
    bool needExplicitOffset = Measurer{}.measure(curr->offset) > 1;
    if (needExplicitOffset) {
      o << "(offset ";
    }
    visit(curr->offset);
    if (needExplicitOffset) {
      o << ')';
    }

    if (usesExpressions || currModule->tables.size() > 1) {
      o << ' ';
      printElemType();
    }
  } else {
    o << ' ';
    printElemType();
  }

  if (!usesExpressions) {
    for (auto* entry : curr->data) {
      auto* refFunc = entry->cast<RefFunc>();
      o << ' ';
      refFunc->func.print(o);
    }
  } else {
    for (auto* entry : curr->data) {
      o << " (item ";
      visit(entry);
      o << ')';
    }
  }
  o << ')' << maybeNewLine;
}